

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O3

int __thiscall
QSslSocketPrivate::bind(QSslSocketPrivate *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  QHostAddressPrivate *pQVar1;
  quint16 qVar2;
  int iVar3;
  qintptr qVar4;
  undefined4 in_register_00000034;
  QTcpSocket *pQVar5;
  long in_FS_OFFSET;
  QHostAddressPrivate *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.field_0x26f == '\0') {
    init(this,(EVP_PKEY_CTX *)CONCAT44(in_register_00000034,__fd));
  }
  (this->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.field_0x26f = 0;
  pQVar5 = this->plainSocket;
  if (pQVar5 == (QTcpSocket *)0x0) {
    createPlainSocket(this,(OpenMode)0x3);
    pQVar5 = this->plainSocket;
  }
  iVar3 = (**(code **)(*(long *)&pQVar5->super_QAbstractSocket + 0xf0))
                    (pQVar5,(EVP_PKEY_CTX *)CONCAT44(in_register_00000034,__fd),
                     (ulong)__addr & 0xffff,__len);
  qVar2 = QAbstractSocket::localPort(&this->plainSocket->super_QAbstractSocket);
  (this->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.localPort = qVar2;
  QAbstractSocket::localAddress((QAbstractSocket *)&local_30);
  pQVar1 = (this->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.localAddress.d.d.ptr;
  (this->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.localAddress.d.d.ptr = local_30;
  local_30 = pQVar1;
  QHostAddress::~QHostAddress((QHostAddress *)&local_30);
  qVar4 = (**(code **)(*(long *)&this->plainSocket->super_QAbstractSocket + 0x110))();
  (this->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.cachedSocketDescriptor = qVar4;
  *(undefined8 *)&(this->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.field_0xa8 = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QSslSocketPrivate::bind(const QHostAddress &address, quint16 port, QAbstractSocket::BindMode mode)
{
    // this function is called from QAbstractSocket::bind
    if (!initialized)
        init();
    initialized = false;

#ifdef QSSLSOCKET_DEBUG
    qCDebug(lcSsl) << "QSslSocket::bind(" << address << ',' << port << ',' << mode << ')';
#endif
    if (!plainSocket) {
#ifdef QSSLSOCKET_DEBUG
        qCDebug(lcSsl) << "\tcreating internal plain socket";
#endif
        createPlainSocket(QIODevice::ReadWrite);
    }
    bool ret = plainSocket->bind(address, port, mode);
    localPort = plainSocket->localPort();
    localAddress = plainSocket->localAddress();
    cachedSocketDescriptor = plainSocket->socketDescriptor();
    readChannelCount = writeChannelCount = 0;
    return ret;
}